

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O3

void __thiscall ON_Brep::FlipLoop(ON_Brep *this,ON_BrepLoop *loop)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  ON_BrepTrim *pOVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  iVar1 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_count;
  iVar2 = (loop->m_ti).m_count;
  lVar9 = (long)iVar2;
  if (1 < lVar9) {
    piVar4 = (loop->m_ti).m_a;
    lVar7 = 0;
    lVar8 = lVar9 + -2;
    do {
      iVar3 = piVar4[lVar7];
      piVar4[lVar7] = piVar4[lVar8 + 1];
      piVar4[lVar8 + 1] = iVar3;
      lVar7 = lVar7 + 1;
      bVar6 = lVar7 < lVar8;
      lVar8 = lVar8 + -1;
    } while (bVar6);
  }
  if (0 < iVar2) {
    lVar8 = 0;
    do {
      iVar2 = (loop->m_ti).m_a[lVar8];
      lVar7 = (long)iVar2;
      if ((-1 < lVar7) && (iVar2 < iVar1)) {
        pOVar5 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
        (*pOVar5[lVar7].super_ON_CurveProxy.super_ON_Curve.super_ON_Geometry.super_ON_Object.
          _vptr_ON_Object[0x38])(pOVar5 + lVar7);
      }
      lVar8 = lVar8 + 1;
    } while (lVar9 != lVar8);
  }
  return;
}

Assistant:

void 
ON_Brep::FlipLoop(ON_BrepLoop& loop)
{
  int ti, lti;
  const int brep_trim_count = m_T.Count();
  const int loop_trim_count = loop.m_ti.Count();

  // reverse order of trimming curves
  loop.m_ti.Reverse();
  // reverse direction of individual trimming curves
  for ( lti = 0; lti < loop_trim_count; lti++ ) 
  {
    ti = loop.m_ti[lti];
    if ( ti >= 0 && ti < brep_trim_count ) 
    {
      m_T[ti].Reverse();
    }
  }
}